

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,Type *params,char **params_1,StringPtr *params_2,
          char **params_3,String *params_4,String *params_5,char (*params_6) [2])

{
  Type *value;
  char **ppcVar1;
  StringPtr *value_00;
  String *pSVar2;
  char (*value_01) [2];
  String *params_6_00;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  NoInfer<kj::String> *local_38;
  String *params_local_4;
  char **params_local_3;
  StringPtr *params_local_2;
  char **params_local_1;
  Type *params_local;
  
  params_6_00 = __return_storage_ptr__;
  local_38 = (NoInfer<kj::String> *)params_3;
  params_local_4 = (String *)params_2;
  params_local_3 = params_1;
  params_local_2 = (StringPtr *)params;
  params_local_1 = (char **)this;
  params_local = (Type *)__return_storage_ptr__;
  value = fwd<kj::Exception::Type>((NoInfer<kj::Exception::Type> *)this);
  local_48 = (ArrayPtr<const_char>)toCharSequence<kj::Exception::Type>(value);
  ppcVar1 = fwd<char_const*>((NoInfer<const_char_*> *)params_local_2);
  local_58 = toCharSequence<char_const*>(ppcVar1);
  value_00 = fwd<kj::StringPtr>((NoInfer<kj::StringPtr> *)params_local_3);
  local_68 = toCharSequence<kj::StringPtr>(value_00);
  ppcVar1 = fwd<char_const*>((NoInfer<const_char_*> *)params_local_4);
  local_78 = toCharSequence<char_const*>(ppcVar1);
  pSVar2 = fwd<kj::String>(local_38);
  local_88 = toCharSequence<kj::String>(pSVar2);
  pSVar2 = fwd<kj::String>(params_4);
  local_98 = toCharSequence<kj::String>(pSVar2);
  value_01 = ::const((char (*) [2])params_5);
  local_a8 = toCharSequence<char_const(&)[2]>(value_01);
  _::
  concat<kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_6_00,(_ *)&local_48,(StringPtr *)&local_58,&local_68,&local_78,&local_88,
             &local_98,&local_a8,(ArrayPtr<const_char> *)params_6_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}